

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::flip_y(mipmapped_texture *this,bool update_orientation_flags)

{
  orientation_flags_t *poVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  bool bVar3;
  uint f;
  ulong uVar4;
  uint m;
  ulong uVar5;
  mipmapped_texture temp_tex;
  mipmapped_texture local_60;
  
  mipmapped_texture(&local_60,this);
  bVar3 = flip_y_helper(&local_60);
  if (!bVar3) {
    operator=(&local_60,this);
    unpack_from_dxt(&local_60,false);
    bVar3 = flip_y_helper(&local_60);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_001353e6;
    }
  }
  swap(this,&local_60);
  bVar3 = true;
  if (update_orientation_flags) {
    for (uVar4 = 0; uVar4 < (this->m_faces).m_size; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; pvVar2 = (this->m_faces).m_p, uVar5 < pvVar2[uVar4].m_size; uVar5 = uVar5 + 1)
      {
        poVar1 = &pvVar2[uVar4].m_p[uVar5]->m_orient_flags;
        *poVar1 = *poVar1 ^ cOrientationFlagYFlipped;
      }
    }
  }
LAB_001353e6:
  ~mipmapped_texture(&local_60);
  return bVar3;
}

Assistant:

bool mipmapped_texture::flip_y(bool update_orientation_flags) {
  mipmapped_texture temp_tex(*this);
  if (!temp_tex.flip_y_helper()) {
    temp_tex = *this;
    temp_tex.unpack_from_dxt(true);
    if (!temp_tex.flip_y_helper())
      return false;
  }
  swap(temp_tex);

  if (update_orientation_flags) {
    for (uint f = 0; f < get_num_faces(); f++) {
      for (uint m = 0; m < get_face(f).size(); m++) {
        uint orient_flags = get_face(f)[m]->get_orientation_flags();
        orient_flags ^= cOrientationFlagYFlipped;
        get_face(f)[m]->set_orientation_flags(static_cast<orientation_flags_t>(orient_flags));
      }
    }
  }

  CRNLIB_ASSERT(check());

  return true;
}